

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O0

void __thiscall
VectorFormatter<DefaultFormatter>::
Ser<ParamsStream<DataStream&,TransactionSerParams>,std::vector<CTxIn,std::allocator<CTxIn>>>
          (VectorFormatter<DefaultFormatter> *this,
          ParamsStream<DataStream_&,_TransactionSerParams> *s,
          vector<CTxIn,_std::allocator<CTxIn>_> *v)

{
  long lVar1;
  bool bVar2;
  vector<CTxIn,_std::allocator<CTxIn>_> *in_RSI;
  long in_FS_OFFSET;
  value_type *elem;
  vector<CTxIn,_std::allocator<CTxIn>_> *__range2;
  DefaultFormatter formatter;
  const_iterator __end0;
  const_iterator __begin0;
  ParamsStream<DataStream_&,_TransactionSerParams> *in_stack_ffffffffffffffa8;
  reference in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::size
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffffa8);
  WriteCompactSize<ParamsStream<DataStream&,TransactionSerParams>>
            ((ParamsStream<DataStream_&,_TransactionSerParams> *)in_stack_ffffffffffffffb8,
             (uint64_t)in_RSI);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::begin(in_RSI);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::end(in_RSI);
  while( true ) {
    bVar2 = __gnu_cxx::operator==<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                      ((__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                        *)in_stack_ffffffffffffffb8,
                       (__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                        *)in_RSI);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    in_stack_ffffffffffffffb8 =
         __gnu_cxx::__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>::
         operator*((__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_> *)
                   in_stack_ffffffffffffffa8);
    DefaultFormatter::Ser<ParamsStream<DataStream&,TransactionSerParams>,CTxIn>
              (in_stack_ffffffffffffffa8,(CTxIn *)0x4553c3);
    __gnu_cxx::__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>::
    operator++((__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_> *)
               in_stack_ffffffffffffffa8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Ser(Stream& s, const V& v)
    {
        Formatter formatter;
        WriteCompactSize(s, v.size());
        for (const typename V::value_type& elem : v) {
            formatter.Ser(s, elem);
        }
    }